

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<Resource,_8UL>::SmallVector(SmallVector<Resource,_8UL> *this)

{
  Resource *pRVar1;
  SmallVector<Resource,_8UL> *this_local;
  
  VectorView<Resource>::VectorView(&this->super_VectorView<Resource>);
  this->buffer_capacity = 0;
  pRVar1 = AlignedBuffer<Resource,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<Resource>).ptr = pRVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}